

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

RepliStruct * __thiscall r_comp::RepliStruct::print_abi_cxx11_(RepliStruct *this)

{
  bool bVar1;
  reference psVar2;
  __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  int *in_RSI;
  undefined1 local_250 [32];
  undefined1 local_230 [8];
  Ptr arg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  undefined1 local_1a8 [32];
  __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
  local_188;
  const_iterator iterEnd;
  const_iterator last;
  const_iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  undefined1 local_b0 [64];
  undefined1 local_70 [8];
  Ptr arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range2;
  string local_38 [8];
  string str;
  RepliStruct *this_local;
  
  std::__cxx11::string::string(local_38);
  switch(*in_RSI) {
  case 0:
    __end2_1 = std::
               vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ::begin((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        *)(in_RSI + 0x2c));
    arg_1.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                *)(in_RSI + 0x2c));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                               *)&arg_1.
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount), bVar1) {
      psVar2 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
               ::operator*(&__end2_1);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)local_230,psVar2);
      std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_230);
      print_abi_cxx11_((RepliStruct *)local_250);
      std::__cxx11::string::operator+=(local_38,(string *)local_250);
      std::__cxx11::string::~string((string *)local_250);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)local_230);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
      ::operator++(&__end2_1);
    }
    std::__cxx11::string::string((string *)this,local_38);
    break;
  case 1:
  case 4:
  case 5:
  case 6:
    std::__cxx11::string::operator=(local_38,(string *)(in_RSI + 2));
    __end2 = std::
             vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ::begin((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      *)(in_RSI + 0x2c));
    arg.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                *)(in_RSI + 0x2c));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                       *)&arg.
                                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), bVar1) {
      psVar2 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
               ::operator*(&__end2);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)local_70,psVar2);
      std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_70);
      print_abi_cxx11_((RepliStruct *)local_b0);
      std::operator+(local_b0 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ca3ad);
      std::__cxx11::string::operator+=(local_38,(string *)(local_b0 + 0x20));
      std::__cxx11::string::~string((string *)(local_b0 + 0x20));
      std::__cxx11::string::~string((string *)local_b0);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_70)
      ;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
      ::operator++(&__end2);
    }
    if (*in_RSI == 1) {
      std::operator+(local_110,(char *)(in_RSI + 0x12));
      std::operator+(local_f0,local_110);
      std::operator+(local_d0,(char *)local_f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)local_110);
    }
    else if (*in_RSI == 6) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter,
                     (char *)(in_RSI + 0x12));
      std::operator+(local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter);
      std::operator+(local_130,(char *)local_150);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_130);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_150);
      std::__cxx11::string::~string((string *)&iter);
    }
    else {
      std::__cxx11::string::string((string *)this,local_38);
    }
    break;
  case 2:
    last = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::begin((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    *)(in_RSI + 0x2c));
    iterEnd = std::
              vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ::end((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                     *)(in_RSI + 0x2c));
    local_188 = __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                ::operator--(&iterEnd,0);
    while (bVar1 = __gnu_cxx::operator!=(&last,&local_188), bVar1) {
      this_00 = (__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                   ::operator*(&last);
      std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(this_00);
      print_abi_cxx11_((RepliStruct *)local_1a8);
      std::__cxx11::string::operator+=(local_38,(string *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      bVar1 = __gnu_cxx::operator!=(&last,&iterEnd);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_38," ");
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
      ::operator++(&last);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_1,
                   (char *)(in_RSI + 0x12));
    std::operator+(local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_1)
    ;
    std::operator+(local_1c8,(char *)local_1e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&__range2_1);
    break;
  case 3:
    std::__cxx11::string::string((string *)this,(string *)(in_RSI + 2));
    break;
  default:
    std::__cxx11::string::string((string *)this,local_38);
  }
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string RepliStruct::print() const
{
    std::string str;

    switch (type) {
    case Atom:
        return cmd;

    case Structure:
    case Development:
    case Directive:
    case Condition:
        str = cmd;

        for (RepliStruct::Ptr arg : args) {
            str += " " + arg->print();
        }

        if (type == Structure) {
            return label + "(" + str + ")" + tail;
        } else if (type == Development) {
            return label + "{" + str + "}" + tail;
        } else {
            return str;
        }

    case Set:
        for (std::vector<RepliStruct::Ptr>::const_iterator iter(args.begin()), last(args.end()), iterEnd(last--); iter != iterEnd; ++iter) {
            str += (*iter)->print();

            if (iter != last) {
                str += " ";
            }
        }

        return label + "[" + str + "]" + tail;

    case Root:
        for (RepliStruct::Ptr arg : args) {
            str += arg->print();
        }

        return str;

    default:
        break;
    }

    return str;
}